

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Tags::ExpandTagsArray(Tags *this)

{
  Tag *pTVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  Tag *this_00;
  ulong uVar6;
  Tag *local_b8;
  Tag *local_90;
  int local_84;
  Tag *dst;
  Tag *src;
  int idx;
  Tag *tags;
  int size;
  Tags *this_local;
  
  if (this->tags_count_ < this->tags_size_) {
    this_local._7_1_ = true;
  }
  else {
    if (this->tags_size_ == 0) {
      local_84 = 1;
    }
    else {
      local_84 = this->tags_size_ << 1;
    }
    uVar3 = (ulong)local_84;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar3;
    uVar4 = SUB168(auVar2 * ZEXT816(0x10),0);
    uVar6 = uVar4 + 8;
    if (SUB168(auVar2 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar4) {
      uVar6 = 0xffffffffffffffff;
    }
    puVar5 = (ulong *)operator_new__(uVar6,(nothrow_t *)&std::nothrow);
    local_90 = (Tag *)0x0;
    if (puVar5 != (ulong *)0x0) {
      *puVar5 = uVar3;
      local_90 = (Tag *)(puVar5 + 1);
      if (uVar3 != 0) {
        local_b8 = local_90;
        do {
          Tag::Tag(local_b8);
          local_b8 = local_b8 + 1;
        } while (local_b8 != local_90 + uVar3);
      }
    }
    if (local_90 == (Tag *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      for (src._0_4_ = 0; (int)src < this->tags_count_; src._0_4_ = (int)src + 1) {
        Tag::ShallowCopy(this->tags_ + (int)src,local_90 + (int)src);
      }
      pTVar1 = this->tags_;
      if (pTVar1 != (Tag *)0x0) {
        this_00 = pTVar1 + *(long *)&pTVar1[-1].simple_tags_size_;
        while (pTVar1 != this_00) {
          this_00 = this_00 + -1;
          Tag::~Tag(this_00);
        }
        operator_delete__(&pTVar1[-1].simple_tags_size_);
      }
      this->tags_ = local_90;
      this->tags_size_ = local_84;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Tags::ExpandTagsArray() {
  if (tags_size_ > tags_count_)
    return true;  // nothing to do yet

  const int size = (tags_size_ == 0) ? 1 : 2 * tags_size_;

  Tag* const tags = new (std::nothrow) Tag[size];  // NOLINT
  if (tags == NULL)
    return false;

  for (int idx = 0; idx < tags_count_; ++idx) {
    const Tag& src = tags_[idx];
    Tag* const dst = tags + idx;
    src.ShallowCopy(dst);
  }

  delete[] tags_;

  tags_ = tags;
  tags_size_ = size;

  return true;
}